

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_combo_separator(nk_context *ctx,char *items_separated_by_separator,int separator,int selected
                      ,int count,int item_height,nk_vec2 size)

{
  char cVar1;
  nk_vec2 nVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  float fVar9;
  float local_48;
  float fStack_44;
  
  if (items_separated_by_separator != (char *)0x0 && ctx != (nk_context *)0x0) {
    iVar8 = (int)(ctx->style).window.spacing.y;
    nVar2 = nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
    local_48 = size.x;
    fStack_44 = size.y;
    fVar9 = (float)((iVar8 + item_height) * count + ((int)nVar2.y + iVar8) * 2);
    if (fVar9 <= fStack_44) {
      fStack_44 = fVar9;
    }
    pcVar7 = items_separated_by_separator;
    if (count < 1) {
      iVar8 = 0;
    }
    else {
      iVar3 = 0;
      do {
        iVar8 = -1;
        pcVar6 = pcVar7;
        do {
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + 1;
          iVar8 = iVar8 + 1;
          if (cVar1 == '\0') break;
        } while (cVar1 != separator);
      } while ((iVar3 != selected) && (iVar3 = iVar3 + 1, pcVar7 = pcVar6, iVar3 != count));
    }
    nVar2.y = fStack_44;
    nVar2.x = local_48;
    iVar8 = nk_combo_begin_text(ctx,pcVar7,iVar8,nVar2);
    if (iVar8 != 0) {
      iVar8 = 0;
      nk_row_layout(ctx,NK_DYNAMIC,(float)item_height,1,0);
      if (0 < count) {
        do {
          lVar4 = 0;
          lVar5 = -0x100000000;
          do {
            lVar5 = lVar5 + 0x100000000;
            pcVar7 = items_separated_by_separator + lVar4;
            lVar4 = lVar4 + 1;
            if (*pcVar7 == '\0') break;
          } while (*pcVar7 != separator);
          iVar3 = nk_contextual_item_text(ctx,items_separated_by_separator,(int)lVar4 + -1,0x11);
          if (iVar3 != 0) {
            selected = iVar8;
          }
          items_separated_by_separator = items_separated_by_separator + (lVar5 >> 0x20) + 1;
          iVar8 = iVar8 + 1;
        } while (iVar8 != count);
      }
      nk_contextual_end(ctx);
    }
  }
  return selected;
}

Assistant:

NK_API int
nk_combo_separator(struct nk_context *ctx, const char *items_separated_by_separator,
    int separator, int selected, int count, int item_height, struct nk_vec2 size)
{
    int i;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;
    const char *current_item;
    const char *iter;
    int length = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(items_separated_by_separator);
    if (!ctx || !items_separated_by_separator)
        return selected;

    /* calculate popup window */
    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);

    /* find selected item */
    current_item = items_separated_by_separator;
    for (i = 0; i < count; ++i) {
        iter = current_item;
        while (*iter && *iter != separator) iter++;
        length = (int)(iter - current_item);
        if (i == selected) break;
        current_item = iter + 1;
    }

    if (nk_combo_begin_text(ctx, current_item, length, size)) {
        current_item = items_separated_by_separator;
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            iter = current_item;
            while (*iter && *iter != separator) iter++;
            length = (int)(iter - current_item);
            if (nk_combo_item_text(ctx, current_item, length, NK_TEXT_LEFT))
                selected = i;
            current_item = current_item + length + 1;
        }
        nk_combo_end(ctx);
    }
    return selected;
}